

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O2

bool __thiscall
cmBinUtilsMacOSMachOLinker::GetFileDependencies
          (cmBinUtilsMacOSMachOLinker *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names,string *executablePath,string *loaderPath,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rpaths)

{
  string *psVar1;
  cmRuntimeDependencyArchive *this_00;
  bool bVar2;
  string *name;
  bool unique;
  bool resolved;
  string path;
  string filename;
  bool local_82;
  bool local_81;
  string *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  string local_70;
  string local_50;
  
  name = (names->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_80 = loaderPath;
  local_78 = rpaths;
  do {
    if (name == psVar1) {
LAB_00305287:
      return name == psVar1;
    }
    bVar2 = cmRuntimeDependencyArchive::IsPreExcluded((this->super_cmBinUtilsLinker).Archive,name);
    if (!bVar2) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      bVar2 = ResolveDependency(this,name,executablePath,local_80,local_78,&local_70,&local_81);
      if (!bVar2) {
LAB_0030527d:
        std::__cxx11::string::~string((string *)&local_70);
        goto LAB_00305287;
      }
      this_00 = (this->super_cmBinUtilsLinker).Archive;
      if (local_81 == true) {
        bVar2 = cmRuntimeDependencyArchive::IsPostExcluded(this_00,&local_70);
        if (!bVar2) {
          cmsys::SystemTools::GetFilenameName(&local_50,&local_70);
          cmRuntimeDependencyArchive::AddResolvedPath
                    ((this->super_cmBinUtilsLinker).Archive,&local_50,&local_70,&local_82);
          if (local_82 == true) {
            bVar2 = ScanDependencies(this,&local_70,executablePath);
            if (!bVar2) {
              std::__cxx11::string::~string((string *)&local_50);
              goto LAB_0030527d;
            }
          }
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      else {
        cmRuntimeDependencyArchive::AddUnresolvedPath(this_00,name);
      }
      std::__cxx11::string::~string((string *)&local_70);
    }
    name = name + 1;
  } while( true );
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::GetFileDependencies(
  std::vector<std::string> const& names, std::string const& executablePath,
  std::string const& loaderPath, std::vector<std::string> const& rpaths)
{
  for (std::string const& name : names) {
    if (!this->Archive->IsPreExcluded(name)) {
      std::string path;
      bool resolved;
      if (!this->ResolveDependency(name, executablePath, loaderPath, rpaths,
                                   path, resolved)) {
        return false;
      }
      if (resolved) {
        if (!this->Archive->IsPostExcluded(path)) {
          auto filename = cmSystemTools::GetFilenameName(path);
          bool unique;
          this->Archive->AddResolvedPath(filename, path, unique);
          if (unique && !this->ScanDependencies(path, executablePath)) {
            return false;
          }
        }
      } else {
        this->Archive->AddUnresolvedPath(name);
      }
    }
  }

  return true;
}